

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

uint __thiscall
Inline::FillInlineesDataArray
          (Inline *this,FunctionJITTimeInfo *inlineeJitTimeData,
          FunctionJITTimeInfo **inlineesDataArray,uint inlineesDataArrayLength)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  intptr_t polyFuncInfo;
  FunctionJITTimeInfo *this_00;
  JITTimeFunctionBody *pJVar4;
  JITTimeFunctionBody *pJVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  uint uVar8;
  ulong uVar9;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  
  if (inlineeJitTimeData == (FunctionJITTimeInfo *)0x0) {
    uVar8 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar8 = 0;
    do {
      if (inlineesDataArrayLength <= uVar8) {
        do {
          uVar8 = uVar8 + 1;
          inlineeJitTimeData = FunctionJITTimeInfo::GetNext(inlineeJitTimeData);
        } while (inlineeJitTimeData != (FunctionJITTimeInfo *)0x0);
        return uVar8;
      }
      polyFuncInfo = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
      bVar2 = FunctionJITTimeInfo::HasBody(inlineeJitTimeData);
      if (bVar2) {
        sourceContextId = FunctionJITTimeInfo::GetSourceContextId(inlineeJitTimeData);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(inlineeJitTimeData);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015a4e90,PolymorphicInlinePhase,sourceContextId,functionId
                          );
        if (!bVar2) {
          this_00 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                              (inlineeJitTimeData,polyFuncInfo);
          if (this_00 == (FunctionJITTimeInfo *)0x0) {
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
            if (bVar2) {
              pJVar4 = FunctionJITTimeInfo::GetBody(inlineeJitTimeData);
              pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar4);
              pcVar7 = FunctionJITTimeInfo::GetDebugNumberSet
                                 (inlineeJitTimeData,(wchar (*) [42])local_b8);
              Output::Print(L"INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"
                            ,pcVar6,pcVar7);
              Output::Flush();
            }
          }
          else {
            inlineesDataArray[uVar8] = this_00;
            pJVar4 = FunctionJITTimeInfo::GetBody(this_00);
            pJVar5 = FunctionJITTimeInfo::GetBody(inlineeJitTimeData);
            if (pJVar4 != pJVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x287,
                                 "(rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody())"
                                 ,
                                 "rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody()"
                                );
              if (!bVar2) {
LAB_00545ed9:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar3 = 0;
            }
            if (uVar8 != 0) {
              uVar9 = 0;
              do {
                pJVar4 = FunctionJITTimeInfo::GetBody(inlineesDataArray[uVar9]);
                pJVar5 = FunctionJITTimeInfo::GetBody(inlineeJitTimeData);
                if (pJVar4 == pJVar5) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar3 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x28d,"(false)",
                                     "We should never see duplicate function body here");
                  if (!bVar2) goto LAB_00545ed9;
                  *puVar3 = 0;
                }
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            uVar8 = uVar8 + 1;
          }
        }
      }
      inlineeJitTimeData = FunctionJITTimeInfo::GetNext(inlineeJitTimeData);
    } while (inlineeJitTimeData != (FunctionJITTimeInfo *)0x0);
  }
  return uVar8;
}

Assistant:

uint Inline::FillInlineesDataArray(
        const FunctionJITTimeInfo* inlineeJitTimeData,
        _Out_writes_to_(inlineesDataArrayLength, (return >= inlineesDataArrayLength ? inlineesDataArrayLength : return)) const FunctionJITTimeInfo ** inlineesDataArray,
        uint inlineesDataArrayLength
        )
{
    uint inlineeCount = 0;
    while(inlineeJitTimeData)
    {
        if (inlineeCount >= inlineesDataArrayLength)
        {
            // Count the actual number of inlinees for logging.
            while (inlineeJitTimeData)
            {
                inlineeCount++;
                inlineeJitTimeData = inlineeJitTimeData->GetNext();
            }
            return inlineeCount;
        }

        intptr_t inlineeFunctionInfoAddr = inlineeJitTimeData->GetFunctionInfoAddr();
#ifdef DBG
        if (inlineeJitTimeData->HasBody() && !PHASE_OFF(Js::PolymorphicInlinePhase, inlineeJitTimeData))
#endif
        {
            const FunctionJITTimeInfo* rightInlineeJitTimeData = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeFunctionInfoAddr);

            if (rightInlineeJitTimeData)
            {
                inlineesDataArray[inlineeCount] = rightInlineeJitTimeData;
                Assert(rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody());
#ifdef DBG
                for (uint k = 0; k < inlineeCount; k++)
                {
                    if (inlineesDataArray[k]->GetBody()  == inlineeJitTimeData->GetBody())
                    {
                        AssertMsg(false, "We should never see duplicate function body here");
                    }
                }
#endif
                inlineeCount++;
            }
            else
            {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer));
            }
        }
        inlineeJitTimeData = inlineeJitTimeData->GetNext();
    }

    return inlineeCount;
}